

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

VkPipelineStageFlags Diligent::ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE StateFlags)

{
  uint uVar1;
  uint uVar2;
  RESOURCE_STATE RVar3;
  bool bVar4;
  string msg;
  string local_50;
  
  if (StateFlags < 0x400000) {
    if (StateFlags == RESOURCE_STATE_UNKNOWN) {
      return 0;
    }
  }
  else {
    FormatString<char[38]>(&local_50,(char (*) [38])"Resource state flags are out of range");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ResourceStateFlagsToVkAccessFlags",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x524);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = 0;
  do {
    RVar3 = -StateFlags & StateFlags;
    if ((int)RVar3 < 0x800) {
      if ((int)RVar3 < 0x40) {
        uVar1 = 0;
        switch(RVar3) {
        case RESOURCE_STATE_UNDEFINED:
          break;
        case RESOURCE_STATE_VERTEX_BUFFER:
          uVar1 = 4;
          break;
        case RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
        case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_UNDEFINED:
        case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER:
        case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
          goto switchD_002763f3_caseD_3;
        case RESOURCE_STATE_CONSTANT_BUFFER:
          uVar1 = 8;
          break;
        case RESOURCE_STATE_INDEX_BUFFER:
          uVar1 = 2;
          break;
        default:
          if (RVar3 == RESOURCE_STATE_RENDER_TARGET) {
            uVar1 = 0x180;
          }
          else {
            if (RVar3 != RESOURCE_STATE_UNORDERED_ACCESS) goto switchD_002763f3_caseD_3;
            uVar1 = 0x60;
          }
        }
      }
      else if ((int)RVar3 < 0x100) {
        if (RVar3 == RESOURCE_STATE_DEPTH_WRITE) {
          uVar1 = 0x600;
        }
        else {
          if (RVar3 != RESOURCE_STATE_DEPTH_READ) goto switchD_002763f3_caseD_3;
          uVar1 = 0x200;
        }
      }
      else {
        if (RVar3 == RESOURCE_STATE_SHADER_RESOURCE) goto LAB_002764f9;
        if (RVar3 == RESOURCE_STATE_STREAM_OUT) {
          uVar1 = 0x2000000;
        }
        else {
          if (RVar3 != RESOURCE_STATE_INDIRECT_ARGUMENT) goto switchD_002763f3_caseD_3;
          uVar1 = 1;
        }
      }
    }
    else if ((int)RVar3 < 0x10000) {
      if ((int)RVar3 < 0x2000) {
        if (RVar3 == RESOURCE_STATE_COPY_DEST) goto LAB_00276553;
        if (RVar3 == RESOURCE_STATE_COPY_SOURCE) goto LAB_0027654c;
      }
      else {
        if (RVar3 == RESOURCE_STATE_RESOLVE_DEST) {
LAB_00276553:
          uVar1 = 0x1000;
          goto switchD_002763f3_caseD_1;
        }
        if (RVar3 == RESOURCE_STATE_RESOLVE_SOURCE) {
LAB_0027654c:
          uVar1 = 0x800;
          goto switchD_002763f3_caseD_1;
        }
        if (RVar3 == RESOURCE_STATE_INPUT_ATTACHMENT) {
          uVar1 = 0x10;
          goto switchD_002763f3_caseD_1;
        }
      }
switchD_002763f3_caseD_3:
      FormatString<char[31]>(&local_50,(char (*) [31])"Unexpected resource state flag");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"ResourceStateFlagToVkAccessFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x51d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar1 = 0;
    }
    else if ((int)RVar3 < 0x80000) {
      uVar1 = 0;
      if (RVar3 != RESOURCE_STATE_PRESENT) {
        if (RVar3 == RESOURCE_STATE_BUILD_AS_READ) goto LAB_002764f9;
        if (RVar3 != RESOURCE_STATE_BUILD_AS_WRITE) goto switchD_002763f3_caseD_3;
        uVar1 = 0x600000;
      }
    }
    else if (RVar3 == RESOURCE_STATE_RAY_TRACING) {
LAB_002764f9:
      uVar1 = 0x20;
    }
    else {
      uVar1 = 0;
      if (RVar3 != RESOURCE_STATE_COMMON) {
        if (RVar3 != RESOURCE_STATE_MAX_BIT) goto switchD_002763f3_caseD_3;
        uVar1 = 0x1800000;
      }
    }
switchD_002763f3_caseD_1:
    uVar2 = uVar2 | uVar1;
    bVar4 = RVar3 == StateFlags;
    StateFlags = RVar3 ^ StateFlags;
    if (bVar4) {
      return uVar2;
    }
  } while( true );
}

Assistant:

VkPipelineStageFlags ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE StateFlags)
{
    VERIFY(Uint32{StateFlags} < (RESOURCE_STATE_MAX_BIT << 1), "Resource state flags are out of range");

    VkAccessFlags AccessFlags = 0;
    while (StateFlags != RESOURCE_STATE_UNKNOWN)
    {
        RESOURCE_STATE StateBit = ExtractLSB(StateFlags);
        AccessFlags |= ResourceStateFlagToVkAccessFlags(StateBit);
    }
    return AccessFlags;
}